

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int32_t submit_headers_shared
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,
                  nghttp2_priority_spec *pri_spec,nghttp2_nv *nva_copy,size_t nvlen,
                  nghttp2_data_provider *data_prd,void *stream_user_data)

{
  nghttp2_mem *mem_00;
  nghttp2_outbound_item *item_00;
  nghttp2_mem *mem;
  nghttp2_headers_category hcat;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  uint8_t flags_copy;
  int rv;
  size_t nvlen_local;
  nghttp2_nv *nva_copy_local;
  nghttp2_priority_spec *pri_spec_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  mem_00 = &session->mem;
  item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem_00,0x98);
  if (item_00 == (nghttp2_outbound_item *)0x0) {
    item._4_4_ = -0x385;
LAB_00a633e4:
    nghttp2_nv_array_del(nva_copy,mem_00);
  }
  else {
    nghttp2_outbound_item_init(item_00);
    if ((data_prd != (nghttp2_data_provider *)0x0) &&
       (data_prd->read_callback != (nghttp2_data_source_read_callback)0x0)) {
      (item_00->aux_data).data.data_prd.source = data_prd->source;
      (item_00->aux_data).data.data_prd.read_callback = data_prd->read_callback;
    }
    (item_00->aux_data).headers.stream_user_data = stream_user_data;
    if (stream_id == -1) {
      if (0x7fffffff < session->next_stream_id) {
        item._4_4_ = -0x1fd;
        goto LAB_00a633e4;
      }
      pri_spec_local._0_4_ = session->next_stream_id;
      session->next_stream_id = session->next_stream_id + 2;
      mem._4_4_ = NGHTTP2_HCAT_REQUEST;
    }
    else {
      mem._4_4_ = NGHTTP2_HCAT_HEADERS;
      pri_spec_local._0_4_ = stream_id;
    }
    nghttp2_frame_headers_init
              ((nghttp2_headers *)item_00,flags & 0x21 | 4,(uint32_t)pri_spec_local,mem._4_4_,
               pri_spec,nva_copy,nvlen);
    item._4_4_ = nghttp2_session_add_item(session,item_00);
    if (item._4_4_ == 0) {
      if (mem._4_4_ == NGHTTP2_HCAT_REQUEST) {
        return (uint32_t)pri_spec_local;
      }
      return 0;
    }
    nghttp2_frame_headers_free((nghttp2_headers *)item_00,mem_00);
  }
  nghttp2_mem_free(mem_00,item_00);
  return item._4_4_;
}

Assistant:

static int32_t submit_headers_shared(nghttp2_session *session, uint8_t flags,
                                     int32_t stream_id,
                                     const nghttp2_priority_spec *pri_spec,
                                     nghttp2_nv *nva_copy, size_t nvlen,
                                     const nghttp2_data_provider *data_prd,
                                     void *stream_user_data) {
  int rv;
  uint8_t flags_copy;
  nghttp2_outbound_item *item = NULL;
  nghttp2_frame *frame = NULL;
  nghttp2_headers_category hcat;
  nghttp2_mem *mem;

  mem = &session->mem;

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    rv = NGHTTP2_ERR_NOMEM;
    goto fail;
  }

  nghttp2_outbound_item_init(item);

  if (data_prd != NULL && data_prd->read_callback != NULL) {
    item->aux_data.headers.data_prd = *data_prd;
  }

  item->aux_data.headers.stream_user_data = stream_user_data;

  flags_copy =
      (uint8_t)((flags & (NGHTTP2_FLAG_END_STREAM | NGHTTP2_FLAG_PRIORITY)) |
                NGHTTP2_FLAG_END_HEADERS);

  if (stream_id == -1) {
    if (session->next_stream_id > INT32_MAX) {
      rv = NGHTTP2_ERR_STREAM_ID_NOT_AVAILABLE;
      goto fail;
    }

    stream_id = (int32_t)session->next_stream_id;
    session->next_stream_id += 2;

    hcat = NGHTTP2_HCAT_REQUEST;
  } else {
    /* More specific categorization will be done later. */
    hcat = NGHTTP2_HCAT_HEADERS;
  }

  frame = &item->frame;

  nghttp2_frame_headers_init(&frame->headers, flags_copy, stream_id, hcat,
                             pri_spec, nva_copy, nvlen);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_headers_free(&frame->headers, mem);
    goto fail2;
  }

  if (hcat == NGHTTP2_HCAT_REQUEST) {
    return stream_id;
  }

  return 0;

fail:
  /* nghttp2_frame_headers_init() takes ownership of nva_copy. */
  nghttp2_nv_array_del(nva_copy, mem);
fail2:
  nghttp2_mem_free(mem, item);

  return rv;
}